

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O2

int getIDWithAttrMask(uint16_t *instructionID,InternalInstruction *insn,uint16_t attrMask)

{
  uint uVar1;
  InstructionContext IVar2;
  InstrUID IVar3;
  int iVar4;
  OpcodeDecision *pOVar5;
  uint8_t modRM;
  uint8_t *puVar6;
  byte opcode;
  InstructionContext insnContext;
  OpcodeType type;
  
  opcode = insn->opcode;
  type = insn->opcodeType;
  if ((ulong)opcode == 0xe) {
    IVar3 = 0x301;
    if (type == T3DNOW_MAP) goto LAB_00212aa5;
LAB_00212a12:
    uVar1 = type - TWOBYTE;
    if (uVar1 < 6) {
      pOVar5 = (OpcodeDecision *)(&DAT_0040ceac + *(int *)(&DAT_0040ceac + (ulong)uVar1 * 4));
      puVar6 = &DAT_0040cec4 + *(int *)(&DAT_0040cec4 + (ulong)uVar1 * 4);
    }
    else {
      puVar6 = "\x01\x02\x03\x04";
      pOVar5 = x86DisassemblerOneByteOpcodes;
    }
    insnContext = (InstructionContext)""[attrMask];
    if ((puVar6[insnContext] != 0) &&
       (IVar2 = (uint)""[attrMask],
       pOVar5[puVar6[insnContext] - 1].modRMDecisions[opcode].modrm_type != '\0'))
    goto LAB_00212a70;
    modRM = '\0';
  }
  else {
    if (type != T3DNOW_MAP) goto LAB_00212a12;
    IVar2 = IC_OF;
LAB_00212a70:
    insnContext = IVar2;
    iVar4 = readModRM(insn);
    if (iVar4 != 0) {
      return -1;
    }
    type = insn->opcodeType;
    opcode = insn->opcode;
    modRM = insn->modRM;
  }
  IVar3 = decode(type,insnContext,opcode,modRM);
LAB_00212aa5:
  *instructionID = IVar3;
  return 0;
}

Assistant:

static int getIDWithAttrMask(uint16_t *instructionID,
		struct InternalInstruction *insn,
		uint16_t attrMask)
{
	bool hasModRMExtension;

	InstructionContext instructionClass;

#ifndef CAPSTONE_X86_REDUCE
	// HACK for femms. to be handled properly in next version 3.x
	if (insn->opcode == 0x0e && insn->opcodeType == T3DNOW_MAP) {
		*instructionID = X86_FEMMS;
		return 0;
	}
#endif

	if (insn->opcodeType == T3DNOW_MAP)
		instructionClass = IC_OF;
	else
		instructionClass = contextForAttrs(attrMask);

	hasModRMExtension = modRMRequired(insn->opcodeType,
			instructionClass,
			insn->opcode) != 0;

	if (hasModRMExtension) {
		if (readModRM(insn))
			return -1;

		*instructionID = decode(insn->opcodeType,
				instructionClass,
				insn->opcode,
				insn->modRM);
	} else {
		*instructionID = decode(insn->opcodeType,
				instructionClass,
				insn->opcode,
				0);
	}

	return 0;
}